

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_reader_tests.cpp
# Opt level: O3

void check_decode_bson(vector<unsigned_char,_std::allocator<unsigned_char>_> *v,json *expected)

{
  pointer puVar1;
  int iVar2;
  pointer puVar3;
  string s;
  json j2;
  json result;
  AssertionHandler catchAssertionHandler_1;
  istringstream is;
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_278;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_268;
  undefined1 local_258 [8];
  undefined8 local_250;
  bson *local_248;
  _func_int **local_240;
  char *pcStack_238;
  json *local_230;
  bool local_21e;
  IResultCapture *local_218;
  undefined1 local_210 [8];
  undefined8 uStack_208;
  bson *local_200;
  char *local_1f8;
  size_t sStack_1f0;
  json *local_1e8;
  SourceLineInfo local_1e0;
  StringRef local_1d0;
  StringRef local_1c0;
  undefined1 local_1b0 [64];
  IResultCapture *local_170;
  ios_base local_138 [264];
  
  local_1b0._16_4_ = 0x400;
  local_1b0._0_8_ = jsoncons::bson::bson_decode_options::vtable + 0x18;
  local_1b0._8_8_ = 0xb300c8;
  jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((bson *)&local_268,v,(bson_decode_options *)local_1b0);
  local_258 = (undefined1  [8])0x7fc916;
  local_250 = 7;
  local_210 = (undefined1  [8])0x7fce1f;
  uStack_208 = (char *)0x13;
  Catch::StringRef::StringRef(&local_1c0,"result == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_1b0,(StringRef *)local_258,(SourceLineInfo *)local_210,
             local_1c0,Normal);
  iVar2 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    (&local_268,expected);
  Catch::StringRef::StringRef((StringRef *)local_210,"==");
  local_250._0_2_ = CONCAT11(iVar2 == 0,true);
  local_258 = (undefined1  [8])&PTR_streamReconstructedExpression_00b30630;
  local_240 = (_func_int **)local_210;
  pcStack_238 = uStack_208;
  local_248 = (bson *)&local_268;
  local_230 = expected;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_1b0,(ITransientExpression *)local_258);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_258);
  Catch::AssertionHandler::complete((AssertionHandler *)local_1b0);
  if (local_1b0[0x3a] == false) {
    (*local_170->_vptr_IResultCapture[0xe])();
  }
  local_298 = &local_288;
  local_290 = 0;
  local_288 = 0;
  puVar1 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::__cxx11::string::push_back((char)&local_298);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)&local_298,_S_in);
  local_248 = (bson *)CONCAT44(local_248._4_4_,0x400);
  local_258 = (undefined1  [8])(jsoncons::bson::bson_decode_options::vtable + 0x18);
  local_250 = 0xb300c8;
  jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((bson *)&local_278,(istream *)local_1b0,(bson_decode_options *)local_258);
  local_210 = (undefined1  [8])0x7fc916;
  uStack_208 = (char *)0x7;
  local_1e0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_reader_tests.cpp"
  ;
  local_1e0.line = 0x1c;
  Catch::StringRef::StringRef(&local_1d0,"j2 == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_258,(StringRef *)local_210,&local_1e0,local_1d0,Normal);
  iVar2 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    (&local_278,expected);
  Catch::StringRef::StringRef((StringRef *)&local_1e0,"==");
  uStack_208._0_2_ = CONCAT11(iVar2 == 0,true);
  local_210 = (undefined1  [8])&PTR_streamReconstructedExpression_00b30630;
  local_1f8 = local_1e0.file;
  sStack_1f0 = local_1e0.line;
  local_200 = (bson *)&local_278;
  local_1e8 = expected;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_258,(ITransientExpression *)local_210);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_210);
  Catch::AssertionHandler::complete((AssertionHandler *)local_258);
  if (local_21e == false) {
    (*local_218->_vptr_IResultCapture[0xe])();
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_278);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  if (local_298 != &local_288) {
    operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
  }
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_268);
  return;
}

Assistant:

void check_decode_bson(const std::vector<uint8_t>& v, const json& expected)
{
    json result = bson::decode_bson<json>(v);
    REQUIRE(result == expected);

    std::string s;
    for (auto c : v)
    {
        s.push_back(c);
    }
    std::istringstream is(s);
    json j2 = bson::decode_bson<json>(is);
    REQUIRE(j2 == expected);
}